

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::LogFormat::LogFormat(LogFormat *this,LogFormat *logFormat)

{
  long in_RSI;
  Loggable *in_RDI;
  
  Loggable::Loggable(in_RDI);
  in_RDI->_vptr_Loggable = (_func_int **)&PTR__LogFormat_002992a0;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  std::__cxx11::string::string((string *)(in_RDI + 6));
  std::__cxx11::string::string((string *)(in_RDI + 10));
  std::__cxx11::string::string((string *)(in_RDI + 0xf));
  std::__cxx11::string::string((string *)(in_RDI + 0x13));
  *(undefined4 *)&in_RDI[1]._vptr_Loggable = *(undefined4 *)(in_RSI + 8);
  std::__cxx11::string::operator=((string *)(in_RDI + 2),(string *)(in_RSI + 0x10));
  std::__cxx11::string::operator=((string *)(in_RDI + 6),(string *)(in_RSI + 0x30));
  std::__cxx11::string::operator=((string *)(in_RDI + 10),(string *)(in_RSI + 0x50));
  *(undefined4 *)&in_RDI[0xe]._vptr_Loggable = *(undefined4 *)(in_RSI + 0x70);
  std::__cxx11::string::operator=((string *)(in_RDI + 0xf),(string *)(in_RSI + 0x78));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x13),(string *)(in_RSI + 0x98));
  return;
}

Assistant:

LogFormat::LogFormat(LogFormat&& logFormat) {
  m_level = std::move(logFormat.m_level);
  m_userFormat = std::move(logFormat.m_userFormat);
  m_format = std::move(logFormat.m_format);
  m_dateTimeFormat = std::move(logFormat.m_dateTimeFormat);
  m_flags = std::move(logFormat.m_flags);
  m_currentUser = std::move(logFormat.m_currentUser);
  m_currentHost = std::move(logFormat.m_currentHost);
}